

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O3

uint * meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                 (uint *table,size_t buckets,VertexHasher *hash,uint *key,uint *empty)

{
  uchar *puVar1;
  ulong __n;
  size_t sVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  size_t probe;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  puVar1 = hash->vertices;
  __n = hash->vertex_size;
  sVar2 = hash->vertex_stride;
  lVar6 = ((ulong)key & 0xffffffff) * sVar2;
  uVar8 = 0;
  if (3 < __n) {
    piVar4 = (int *)(puVar1 + lVar6);
    uVar5 = __n;
    do {
      uVar7 = (int)uVar8 * 0x5bd1e995 ^
              ((uint)(*piVar4 * 0x5bd1e995) >> 0x18 ^ *piVar4 * 0x5bd1e995) * 0x5bd1e995;
      uVar8 = (ulong)uVar7;
      piVar4 = piVar4 + 1;
      uVar5 = uVar5 - 4;
    } while (3 < uVar5);
    uVar8 = (ulong)uVar7;
  }
  uVar5 = 0;
  while( true ) {
    uVar8 = uVar8 & buckets - 1;
    if ((table[uVar8] == (uint)empty) ||
       (iVar3 = bcmp(puVar1 + table[uVar8] * sVar2,puVar1 + lVar6,__n), iVar3 == 0)) break;
    uVar8 = uVar8 + uVar5 + 1;
    uVar5 = uVar5 + 1;
    if (buckets - 1 < uVar5) {
      return (uint *)0x0;
    }
  }
  return table + uVar8;
}

Assistant:

static T* hashLookup(T* table, size_t buckets, const Hash& hash, const T& key, const T& empty)
{
	assert(buckets > 0);
	assert((buckets & (buckets - 1)) == 0);

	size_t hashmod = buckets - 1;
	size_t bucket = hash.hash(key) & hashmod;

	for (size_t probe = 0; probe <= hashmod; ++probe)
	{
		T& item = table[bucket];

		if (item == empty)
			return &item;

		if (hash.equal(item, key))
			return &item;

		// hash collision, quadratic probing
		bucket = (bucket + probe + 1) & hashmod;
	}

	assert(false && "Hash table is full"); // unreachable
	return 0;
}